

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O0

size_t Assimp::Copy<unsigned_short>(uint8_t *data,unsigned_short *field)

{
  unsigned_short *field_local;
  uint8_t *data_local;
  
  *(unsigned_short *)data = *field;
  return 2;
}

Assistant:

inline 
    std::size_t Copy(uint8_t* data, const T &field) {
#ifdef AI_BUILD_BIG_ENDIAN
        T field_swapped=AI_BE(field);
        std::memcpy(data, &field_swapped, sizeof(field)); return sizeof(field);
#else
        std::memcpy(data, &AI_BE(field), sizeof(field)); return sizeof(field);
#endif
    }